

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O0

void __thiscall
GrcManager::WalkFeatureSettingsTree
          (GrcManager *this,RefAST *ast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vsta)

{
  int iVar1;
  Symbol psym_00;
  size_type_conflict sVar2;
  Symbol pGVar3;
  AST *pAVar4;
  GdlExpression *pGVar5;
  AST *other;
  GdlExpression *in_RDX;
  GrcManager *in_RSI;
  GrcManager *in_RDI;
  RefAST astT;
  GdlExpression *pexpValue;
  RefAST astValue;
  Symbol psym;
  RefAST astNextID;
  RefAST *in_stack_000007a0;
  GrcManager *in_stack_000007a8;
  GrpLineAndFile *in_stack_fffffffffffffd28;
  string *in_stack_fffffffffffffd30;
  GrcStructName *in_stack_fffffffffffffd38;
  GrcSymbolTable *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  GdlSlotRefExpression *in_stack_fffffffffffffd50;
  AST *in_stack_fffffffffffffd58;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  string *in_stack_fffffffffffffd88;
  GdlObject *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  int nID;
  GrcErrorList *in_stack_fffffffffffffda0;
  undefined1 fOverride;
  RefCount<AST> *this_00;
  GrcMasterTable *in_stack_fffffffffffffe20;
  RefCount<AST> in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  string local_1c0 [32];
  RefAST *in_stack_fffffffffffffe60;
  GrcManager *in_stack_fffffffffffffe68;
  string local_130 [32];
  GdlExpression *local_110;
  RefCount<AST> local_108 [10];
  Symbol local_b8;
  int local_ac;
  allocator local_71;
  string local_70 [48];
  string local_40 [32];
  RefCount<AST> in_stack_ffffffffffffffe0;
  GrcManager *this_01;
  
  nID = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  this_01 = in_RSI;
  RefCount<AST>::operator->((RefCount<AST> *)in_RSI);
  this_00 = (RefCount<AST> *)&stack0xffffffffffffffe0;
  AST::getFirstChild((AST *)in_stack_fffffffffffffd28);
  pGVar5 = in_RDX;
  psym_00 = (Symbol)RefCount<AST>::operator->(this_00);
  AST::getText_abi_cxx11_(in_stack_fffffffffffffd58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
  std::__cxx11::string::~string(local_40);
  RefCount<AST>::operator->((RefCount<AST> *)in_RSI);
  iVar1 = AST::getType((AST *)0x27390d);
  if (iVar1 == 4) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pGVar5);
    if (sVar2 < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"Invalid feature statement",&local_71);
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffffd40,
                 (RefCount<AST> *)in_stack_fffffffffffffd38);
      LineAndFile(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      GrcErrorList::AddError
                (in_stack_fffffffffffffda0,nID,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (GrpLineAndFile *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x2739da);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      local_ac = 1;
      goto LAB_00274237;
    }
    SymbolTable(in_RDI);
    fOverride = (undefined1)((ulong)in_RDI >> 0x38);
    GrcStructName::GrcStructName
              ((GrcStructName *)in_stack_fffffffffffffd50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd48);
    RefCount<AST>::RefCount
              ((RefCount<AST> *)in_stack_fffffffffffffd40,(RefCount<AST> *)in_stack_fffffffffffffd38
              );
    LineAndFile(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    pGVar3 = GrcSymbolTable::AddSymbol
                       (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        (SymbolType)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                        in_stack_fffffffffffffd28);
    GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x273b7c);
    RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
    GrcStructName::~GrcStructName((GrcStructName *)0x273b96);
    local_b8 = pGVar3;
    RefCount<AST>::operator->((RefCount<AST> *)&stack0xffffffffffffffe0);
    AST::getNextSibling((AST *)in_stack_fffffffffffffd28);
    pAVar4 = RefCount::operator_cast_to_AST_((RefCount *)local_108);
    if (pAVar4 == (AST *)0x0) {
      local_ac = 1;
    }
    else {
      RefCount<AST>::operator->(local_108);
      iVar1 = AST::getType((AST *)0x273cb6);
      if (iVar1 == 0xd) {
        pGVar5 = (GdlExpression *)operator_new(0x60);
        RefCount<AST>::operator->(local_108);
        AST::getText_abi_cxx11_(in_stack_fffffffffffffd58);
        GdlSlotRefExpression::GdlSlotRefExpression
                  (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        local_110 = pGVar5;
        std::__cxx11::string::~string(local_130);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)in_stack_fffffffffffffd40,
                   (RefCount<AST> *)in_stack_fffffffffffffd38);
        LineAndFile(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        GdlObject::SetLineAndFile((GdlObject *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x273dae);
        RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
      }
      else {
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)in_stack_fffffffffffffd40,
                   (RefCount<AST> *)in_stack_fffffffffffffd38);
        local_110 = WalkExpressionTree(in_stack_000007a8,in_stack_000007a0);
        RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
      }
      PointRadius((GrcManager *)0x273f08);
      PointRadiusUnits((GrcManager *)0x273f1b);
      AttrOverride((GrcManager *)0x273f2e);
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffffd40,
                 (RefCount<AST> *)in_stack_fffffffffffffd38);
      LineAndFile(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      paVar6 = (allocator *)&stack0xfffffffffffffe3f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,"feature setting",paVar6);
      in_stack_fffffffffffffd30 = local_1c0;
      GrcMasterTable::AddItem
                (in_stack_fffffffffffffe20,psym_00,in_RDX,(int)((ulong)this_00 >> 0x20),(int)this_00
                 ,(bool)fOverride,(GrpLineAndFile *)in_stack_fffffffffffffe30.ref,
                 in_stack_fffffffffffffe38);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x274003);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
      local_ac = 0;
    }
    RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
    if (local_ac != 0) goto LAB_00274237;
  }
  else {
    pAVar4 = RefCount<AST>::operator->((RefCount<AST> *)&stack0xffffffffffffffe0);
    AST::getNextSibling((AST *)in_stack_fffffffffffffd28);
    while (other = RefCount::operator_cast_to_AST_((RefCount *)&stack0xfffffffffffffe30),
          other != (AST *)0x0) {
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffffd40,
                 (RefCount<AST> *)in_stack_fffffffffffffd38);
      WalkFeatureSettingsTree
                (this_01,(RefAST *)pGVar5,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffe0.ref);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
      in_stack_fffffffffffffd40 =
           (GrcSymbolTable *)RefCount<AST>::operator->((RefCount<AST> *)&stack0xfffffffffffffe30);
      AST::getNextSibling((AST *)in_stack_fffffffffffffd28);
      RefCount<AST>::operator=(&pAVar4->down,&other->down);
      RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
    }
    RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x27422c);
  local_ac = 0;
LAB_00274237:
  RefCount<AST>::~RefCount((RefCount<AST> *)in_stack_fffffffffffffd30);
  return;
}

Assistant:

void GrcManager::WalkFeatureSettingsTree(RefAST ast, std::vector<std::string> & vsta)
{
	RefAST astNextID = ast->getFirstChild();
	vsta.push_back(astNextID->getText());

	if (ast->getType() == OP_EQ)
	{
		if (vsta.size() < 2)
		{
			g_errorList.AddError(1149, NULL,
				"Invalid feature statement",
				LineAndFile(ast));
			return;
		}

		Symbol psym = SymbolTable()->AddSymbol(GrcStructName(vsta), ksymtFeatSetting,
			LineAndFile(ast));

		RefAST astValue = astNextID->getNextSibling();
		if (!astValue)
			return;

		GdlExpression *pexpValue;
		if (astValue->getType() == IDENT)
		{
			//	A kludge, because this isn't a slot-ref expression, but that is the
			//	most convenient thing to hold a simple identifier until we can process it
			//	further (see the master table function that processes the features).
			pexpValue = new GdlSlotRefExpression(astValue->getText());
			pexpValue->SetLineAndFile(LineAndFile(ast));
		}
		else
		{
			pexpValue = WalkExpressionTree(astValue);
		}
		m_mtbFeatures->AddItem(psym, pexpValue,
			PointRadius(), PointRadiusUnits(), AttrOverride(), LineAndFile(ast),
			"feature setting");
	}
	else
	{
		Assert(ast->getType() == OP_DOT || ast->getType() == ZdotStruct);
		RefAST astT = astNextID->getNextSibling();
		while (astT)
		{
			WalkFeatureSettingsTree(astT, vsta);
			astT = astT->getNextSibling();
		}
	}

	vsta.pop_back();
}